

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O2

int __thiscall ncnn::ReLU::forward_inplace_int8(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int _c;
  Mat local_70;
  
  if (this->slope == 0.0) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar2;
    }
    iVar3 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar3 = 0;
    }
    while (_c = (int)uVar2, _c != iVar3) {
      Mat::channel(&local_70,bottom_top_blob,_c);
      pvVar1 = local_70.data;
      Mat::~Mat(&local_70);
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        if (*(char *)((long)pvVar1 + uVar2) < '\0') {
          *(undefined1 *)((long)pvVar1 + uVar2) = 0;
        }
      }
      uVar2 = (ulong)(_c + 1);
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        // TODO
        // #pragma omp parallel for num_threads(opt.num_threads)
        // for (int q=0; q<channels; q++)
        // {
        //     float* ptr = bottom_top_blob.channel(q);

        //     for (int i=0; i<size; i++)
        //     {
        //         if (ptr[i] < 0)
        //             ptr[i] *= slope;
        //     }
        // }
    }

    return 0;
}